

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

Expression * wasm::TypeUpdating::fixLocalGet(LocalGet *get,Module *wasm)

{
  bool bVar1;
  Builder local_40;
  uint32_t local_34;
  uintptr_t local_30;
  uintptr_t local_28;
  Module *local_20;
  Module *wasm_local;
  LocalGet *get_local;
  
  local_20 = wasm;
  wasm_local = (Module *)get;
  bVar1 = wasm::Type::isNonNullable
                    (&(get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type
                    );
  if ((!bVar1) || (bVar1 = FeatureSet::hasGCNNLocals(&local_20->features), bVar1)) {
    get_local = (LocalGet *)wasm_local;
  }
  else {
    local_30 = (uintptr_t)
               (wasm_local->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_34 = (local_20->features).features;
    local_28 = (uintptr_t)getValidLocalType((Type)local_30,(FeatureSet)local_34);
    (wasm_local->exports).
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_28;
    Builder::Builder(&local_40,local_20);
    get_local = (LocalGet *)Builder::makeRefAs(&local_40,RefAsNonNull,(Expression *)wasm_local);
  }
  return (Expression *)get_local;
}

Assistant:

Expression* fixLocalGet(LocalGet* get, Module& wasm) {
  if (get->type.isNonNullable() && !wasm.features.hasGCNNLocals()) {
    // The get should now return a nullable value, and a ref.as_non_null
    // fixes that up.
    get->type = getValidLocalType(get->type, wasm.features);
    return Builder(wasm).makeRefAs(RefAsNonNull, get);
  }
  return get;
}